

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O1

void __thiscall GLDrawList::SortSpriteIntoPlane(GLDrawList *this,SortNode *head,SortNode *sort)

{
  float fVar1;
  int iVar2;
  int iVar3;
  GLDrawItem *pGVar4;
  GLFlat *pGVar5;
  GLSprite *pGVar6;
  SortNode *pSVar7;
  double dVar8;
  GLSprite *pGVar9;
  SortNode *pSVar10;
  GLSprite *pGVar11;
  float fVar12;
  double dVar13;
  GLSprite s;
  GLSprite local_d0;
  
  dVar8 = ViewPos.Z;
  pGVar4 = (this->drawitems).Array;
  iVar2 = pGVar4[head->itemindex].index;
  iVar3 = pGVar4[sort->itemindex].index;
  pGVar5 = (this->flats).Array;
  pGVar6 = (this->sprites).Array;
  fVar1 = pGVar5[iVar2].z;
  dVar13 = (double)fVar1;
  if ((pGVar6[iVar3].z2 < fVar1 && fVar1 < pGVar6[iVar3].z1) ||
     (pGVar6[iVar3].modelframe != (FSpriteModelFrame *)0x0)) {
    memcpy(&local_d0,pGVar6 + iVar3,0xa0);
    AddSprite(this,&local_d0);
    if (((byte)gl.flags & 0x20) != 0) {
      pGVar6 = (this->sprites).Array;
      pGVar9 = pGVar6 + ((this->sprites).Count - 1);
      iVar3 = (this->drawitems).Array[sort->itemindex].index;
      fVar1 = pGVar5[iVar2].z;
      fVar12 = ((fVar1 - pGVar6[iVar3].z1) * (pGVar6[iVar3].vb - pGVar6[iVar3].vt)) /
               (pGVar6[iVar3].z2 - pGVar6[iVar3].z1) + pGVar6[iVar3].vt;
      if (dVar13 <= dVar8) {
        pGVar11 = pGVar6 + iVar3;
        pGVar9->z2 = fVar1;
        pGVar6[iVar3].z1 = fVar1;
        pGVar9->vb = fVar12;
      }
      else {
        pGVar6[iVar3].z2 = fVar1;
        pGVar9->z1 = fVar1;
        pGVar6[iVar3].vb = fVar12;
        pGVar11 = pGVar9;
      }
      pGVar11->vt = fVar12;
    }
    pSVar10 = StaticSortNodeArray::GetNew(&SortNodes);
    *(undefined8 *)pSVar10 = 0;
    pSVar10->parent = (SortNode *)0x0;
    pSVar10->next = (SortNode *)0x0;
    pSVar10->left = (SortNode *)0x0;
    pSVar10->equal = (SortNode *)0x0;
    pSVar10->right = (SortNode *)0x0;
    pSVar10->itemindex = (this->drawitems).Count - 1;
    pSVar7 = sort->parent;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar7->next = sort->next;
    }
    if (sort->next != (SortNode *)0x0) {
      sort->next->parent = pSVar7;
    }
    sort->parent = (SortNode *)0x0;
    sort->next = (SortNode *)0x0;
    pSVar7 = head->left;
    if (pSVar7 != (SortNode *)0x0) {
      sort->parent = pSVar7->parent;
      pSVar7->parent = sort;
    }
    sort->next = pSVar7;
    if (sort->parent != (SortNode *)0x0) {
      sort->parent->next = sort;
    }
    head->left = sort;
    pSVar7 = pSVar10->parent;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar7->next = pSVar10->next;
    }
    if (pSVar10->next != (SortNode *)0x0) {
      pSVar10->next->parent = pSVar7;
    }
    pSVar10->parent = (SortNode *)0x0;
    pSVar10->next = (SortNode *)0x0;
    pSVar7 = head->right;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar10->parent = pSVar7->parent;
      pSVar7->parent = pSVar10;
    }
    pSVar10->next = pSVar7;
    if (pSVar10->parent != (SortNode *)0x0) {
      pSVar10->parent->next = pSVar10;
    }
    head->right = pSVar10;
  }
  else {
    pSVar7 = sort->parent;
    if ((pGVar6[iVar3].z2 < fVar1 && ViewPos.Z >= dVar13) ||
       (fVar1 < pGVar6[iVar3].z1 && ViewPos.Z < dVar13)) {
      if (pSVar7 != (SortNode *)0x0) {
        pSVar7->next = sort->next;
      }
      if (sort->next != (SortNode *)0x0) {
        sort->next->parent = pSVar7;
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      pSVar7 = head->left;
      if (pSVar7 != (SortNode *)0x0) {
        sort->parent = pSVar7->parent;
        pSVar7->parent = sort;
      }
      sort->next = pSVar7;
      if (sort->parent != (SortNode *)0x0) {
        sort->parent->next = sort;
      }
      head->left = sort;
    }
    else {
      if (pSVar7 != (SortNode *)0x0) {
        pSVar7->next = sort->next;
      }
      if (sort->next != (SortNode *)0x0) {
        sort->next->parent = pSVar7;
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      pSVar7 = head->right;
      if (pSVar7 != (SortNode *)0x0) {
        sort->parent = pSVar7->parent;
        pSVar7->parent = sort;
      }
      sort->next = pSVar7;
      if (sort->parent != (SortNode *)0x0) {
        sort->parent->next = sort;
      }
      head->right = sort;
    }
  }
  return;
}

Assistant:

void GLDrawList::SortSpriteIntoPlane(SortNode * head,SortNode * sort)
{
	GLFlat * fh=&flats[drawitems[head->itemindex].index];
	GLSprite * ss=&sprites[drawitems[sort->itemindex].index];

	bool ceiling = fh->z > ViewPos.Z;

	if ((ss->z1>fh->z && ss->z2<fh->z) || ss->modelframe)
	{
		// We have to split this sprite
		GLSprite s=*ss;
		AddSprite(&s);	// add a copy to avoid reallocation issues.
	
		// Splitting is done in the shader with clip planes, if available
		if (gl.flags & RFL_NO_CLIP_PLANES)
		{
			GLSprite * ss1;
			ss1=&sprites[sprites.Size()-1];
			ss=&sprites[drawitems[sort->itemindex].index];	// may have been reallocated!
			float newtexv=ss->vt + ((ss->vb-ss->vt)/(ss->z2-ss->z1))*(fh->z-ss->z1);

			if (!ceiling)
			{
				ss->z1=ss1->z2=fh->z;
				ss->vt=ss1->vb=newtexv;
			}
			else
			{
				ss1->z1=ss->z2=fh->z;
				ss1->vt=ss->vb=newtexv;
			}
		}

		SortNode * sort2=SortNodes.GetNew();
		memset(sort2,0,sizeof(SortNode));
		sort2->itemindex=drawitems.Size()-1;

		head->AddToLeft(sort);
		head->AddToRight(sort2);
	}
	else if ((ss->z2<fh->z && !ceiling) || (ss->z1>fh->z && ceiling))	// completely on the left side
	{
		head->AddToLeft(sort);
	}
	else
	{
		head->AddToRight(sort);
	}

}